

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

void do_remove(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  OBJ_DATA *pOVar3;
  char *txt;
  OBJ_DATA *obj;
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    txt = "Remove what?\n\r";
  }
  else {
    bVar1 = str_cmp(arg,"all");
    if (!bVar1) {
      pOVar3 = ch->carrying;
      while (obj = pOVar3, obj != (OBJ_DATA *)0x0) {
        pOVar3 = obj->next_content;
        if (((obj->wear_loc != -1) && (bVar1 = can_see_obj(ch,obj), bVar1)) &&
           (obj->wear_loc != 0x13)) {
          remove_obj(ch,(int)obj->wear_loc,true);
        }
      }
      return;
    }
    pOVar3 = get_obj_wear(ch,arg);
    if (pOVar3 != (OBJ_DATA *)0x0) {
      sVar2 = pOVar3->wear_loc;
      if (sVar2 == 0x13) {
        bVar1 = is_immortal(ch);
        if (!bVar1) {
          txt = "You can\'t remove a tattoo!\n\r";
          goto LAB_002be22f;
        }
        sVar2 = pOVar3->wear_loc;
      }
      else if (sVar2 == 0x15) {
        act("$n stops using $p.",ch,pOVar3,(void *)0x0,0);
        act("You stop using $p.",ch,pOVar3,(void *)0x0,3);
        unequip_char(ch,pOVar3,true);
        return;
      }
      remove_obj(ch,(int)sVar2,true);
      return;
    }
    txt = "You do not have that item.\n\r";
  }
LAB_002be22f:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_remove(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Remove what?\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "all"))
	{
		OBJ_DATA *obj_next;

		for (obj = ch->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			if (obj->wear_loc != WEAR_NONE && can_see_obj(ch, obj) && obj->wear_loc != WEAR_BRAND)
				remove_obj(ch, obj->wear_loc, true);
		}

		return;
	}
	else
	{
		obj = get_obj_wear(ch, arg);

		if (obj == nullptr)
		{
			send_to_char("You do not have that item.\n\r", ch);
			return;
		}
	}

	if (obj->wear_loc == WEAR_COSMETIC)
	{
		act("$n stops using $p.", ch, obj, nullptr, TO_ROOM);
		act("You stop using $p.", ch, obj, nullptr, TO_CHAR);
		unequip_char(ch, obj, true);
		return;
	}

	if (obj->wear_loc == WEAR_BRAND && !is_immortal(ch))
	{
		send_to_char("You can't remove a tattoo!\n\r", ch);
		return;
	}

	remove_obj(ch, obj->wear_loc, true);
}